

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O2

CFG * __thiscall
covenant::CycleBreaking<covenant::Sym>::Approximate
          (CFG *__return_storage_ptr__,CycleBreaking<covenant::Sym> *this,CFG *g)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> *__x;
  uint g_00;
  uint uVar2;
  set<int,_std::less<int>,_std::allocator<int>_> group_set;
  vector<int,_std::allocator<int>_> group;
  CFGConnect conn;
  
  CFGConnect::CFGConnect(&conn);
  CFGConnect::scc(&conn,g);
  for (g_00 = 0;
      g_00 < (uint)(((long)conn.groups.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)conn.groups.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18); g_00 = g_00 + 1) {
    __x = CFGConnect::group(&conn,g_00);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &group.super__Vector_base<int,_std::allocator<int>_>,__x);
    group_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    group_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    group_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &group_set._M_t._M_impl.super__Rb_tree_header._M_header;
    group_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar2 = 0;
    group_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         group_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      if ((ulong)((long)group.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)group.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= (ulong)uVar2) break;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &group_set,
                 group.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start + uVar2);
      uVar2 = uVar2 + 1;
    }
    bVar1 = isLinearSCC(this,g,(vector<int,_std::allocator<int>_> *)
                               &group.super__Vector_base<int,_std::allocator<int>_>,&group_set);
    if (!bVar1) {
      cycle_breaking_transf
                (this,g,(vector<int,_std::allocator<int>_> *)
                        &group.super__Vector_base<int,_std::allocator<int>_>,&group_set);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &group_set);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&group.super__Vector_base<int,_std::allocator<int>_>);
  }
  CFG::CFG(__return_storage_ptr__,g);
  CFGConnect::~CFGConnect(&conn);
  return __return_storage_ptr__;
}

Assistant:

CFG Approximate(CFG g)
  {
    CFGConnect conn;
    conn.scc(g);
    // cout << "Mutually recursive groups in the grammar: " << conn << endl;
    for (unsigned int i=0; i < conn.nGroups(); i++)
    {
      vector<int>  group = conn.group(i);
      // For efficient membership queries
      set<int>     group_set;
      for(unsigned j=0; j<group.size(); j++)
        group_set.insert(group[j]);
        
      if (!isLinearSCC(g, group, group_set)) 
        cycle_breaking_transf(g, group, group_set);
    }
    return g;
  }